

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O1

void __thiscall
Clasp::ClaspFacade::Statistics::ClingoView::ClingoView(ClingoView *this,ClaspFacade *f)

{
  Summary *this_00;
  Result *obj;
  Summary *pSVar1;
  ProblemType PVar2;
  FacadePtr pCVar3;
  StatsMap *pSVar4;
  uint32 uVar5;
  int iVar6;
  StatsMap *pSVar7;
  Accu *x;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  void *pvVar11;
  StatisticObject local_50;
  StatisticObject local_48;
  AccuPtr *local_40;
  StatsMap *local_38;
  
  ClaspStatistics::ClaspStatistics(&this->super_ClaspStatistics);
  (this->super_ClaspStatistics).super_AbstractStatistics._vptr_AbstractStatistics =
       (_func_int **)&PTR__ClingoView_001e82d8;
  pSVar4 = &this->problem_;
  local_38 = &this->solving_;
  this_00 = &this->summary_;
  local_40 = &this->accu_;
  (this->problem_).keys_.ebo_.buf = (pointer)0x0;
  (this->problem_).keys_.ebo_.size = 0;
  (this->problem_).keys_.ebo_.cap = 0;
  (this->solving_).keys_.ebo_.buf = (pointer)0x0;
  (this->solving_).keys_.ebo_.size = 0;
  (this->solving_).keys_.ebo_.cap = 0;
  (this->summary_).super_StatsMap.keys_.ebo_.buf = (pointer)0x0;
  (this->summary_).super_StatsMap.keys_.ebo_.size = 0;
  (this->summary_).super_StatsMap.keys_.ebo_.cap = 0;
  (this->summary_).step.times.stats_ = (Summary *)0x0;
  (this->summary_).step.times.range_.lo = 0;
  (this->summary_).step.times.range_.hi = 0;
  (this->summary_).step.models.stats_ = (Summary *)0x0;
  (this->summary_).step.models.range_.lo = 0;
  (this->summary_).step.models.range_.hi = 0;
  (this->accu_).ptr_ = 0;
  pSVar7 = ClaspStatistics::makeRoot(&this->super_ClaspStatistics);
  this->keys_ = pSVar7;
  uVar5 = StatisticObject::registerValue<unsigned_int,_&Clasp::_getValue>();
  StatisticObject::StatisticObject(&local_50,&(f->step_).step,uVar5);
  local_48.handle_ = local_50.handle_;
  StatsMap::add(&this_00->super_StatsMap,"call",&local_48);
  if (_ZGVZN5Clasp15StatisticObject13registerValueINS_11SolveResultETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_110_getResultEPKS2_EEEEjvE6vtab_s
      == '\0') {
    Statistics::ClingoView();
  }
  if (_ZGVZN5Clasp15StatisticObject13registerValueINS_11SolveResultETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_110_getResultEPKS2_EEEEjvE2id
      == '\0') {
    iVar6 = __cxa_guard_acquire(&
                                _ZGVZN5Clasp15StatisticObject13registerValueINS_11SolveResultETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_110_getResultEPKS2_EEEEjvE2id
                               );
    if (iVar6 != 0) {
      local_50.handle_ =
           (uint64)
           _ZZN5Clasp15StatisticObject13registerValueINS_11SolveResultETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_110_getResultEPKS2_EEEEjvE6vtab_s
      ;
      bk_lib::
      pod_vector<const_Clasp::StatisticObject::I_*,_std::allocator<const_Clasp::StatisticObject::I_*>_>
      ::push_back((pod_vector<const_Clasp::StatisticObject::I_*,_std::allocator<const_Clasp::StatisticObject::I_*>_>
                   *)StatisticObject::types_s,(I **)&local_50);
      _ZZN5Clasp15StatisticObject13registerValueINS_11SolveResultETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_110_getResultEPKS2_EEEEjvE2id
           = StatisticObject::types_s._8_4_ - 1;
      __cxa_guard_release(&
                          _ZGVZN5Clasp15StatisticObject13registerValueINS_11SolveResultETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_110_getResultEPKS2_EEEEjvE2id
                         );
    }
  }
  obj = &(f->step_).result;
  StatisticObject::StatisticObject
            (&local_50,obj,
             _ZZN5Clasp15StatisticObject13registerValueINS_11SolveResultETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_110_getResultEPKS2_EEEEjvE2id
            );
  local_48.handle_ = local_50.handle_;
  StatsMap::add(&this_00->super_StatsMap,"result",&local_48);
  if (_ZGVZN5Clasp15StatisticObject13registerValueINS_11SolveResultETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_110_getSignalEPKS2_EEEEjvE6vtab_s
      == '\0') {
    Statistics::ClingoView();
  }
  if (_ZGVZN5Clasp15StatisticObject13registerValueINS_11SolveResultETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_110_getSignalEPKS2_EEEEjvE2id
      == '\0') {
    iVar6 = __cxa_guard_acquire(&
                                _ZGVZN5Clasp15StatisticObject13registerValueINS_11SolveResultETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_110_getSignalEPKS2_EEEEjvE2id
                               );
    if (iVar6 != 0) {
      local_50.handle_ =
           (uint64)
           _ZZN5Clasp15StatisticObject13registerValueINS_11SolveResultETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_110_getSignalEPKS2_EEEEjvE6vtab_s
      ;
      bk_lib::
      pod_vector<const_Clasp::StatisticObject::I_*,_std::allocator<const_Clasp::StatisticObject::I_*>_>
      ::push_back((pod_vector<const_Clasp::StatisticObject::I_*,_std::allocator<const_Clasp::StatisticObject::I_*>_>
                   *)StatisticObject::types_s,(I **)&local_50);
      _ZZN5Clasp15StatisticObject13registerValueINS_11SolveResultETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_110_getSignalEPKS2_EEEEjvE2id
           = StatisticObject::types_s._8_4_ - 1;
      __cxa_guard_release(&
                          _ZGVZN5Clasp15StatisticObject13registerValueINS_11SolveResultETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_110_getSignalEPKS2_EEEEjvE2id
                         );
    }
  }
  StatisticObject::StatisticObject
            (&local_50,obj,
             _ZZN5Clasp15StatisticObject13registerValueINS_11SolveResultETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_110_getSignalEPKS2_EEEEjvE2id
            );
  local_48.handle_ = local_50.handle_;
  StatsMap::add(&this_00->super_StatsMap,"signal",&local_48);
  if (_ZGVZN5Clasp15StatisticObject13registerValueINS_11SolveResultETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_113_getExhaustedEPKS2_EEEEjvE6vtab_s
      == '\0') {
    Statistics::ClingoView();
  }
  if (_ZGVZN5Clasp15StatisticObject13registerValueINS_11SolveResultETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_113_getExhaustedEPKS2_EEEEjvE2id
      == '\0') {
    iVar6 = __cxa_guard_acquire(&
                                _ZGVZN5Clasp15StatisticObject13registerValueINS_11SolveResultETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_113_getExhaustedEPKS2_EEEEjvE2id
                               );
    if (iVar6 != 0) {
      local_50.handle_ =
           (uint64)
           _ZZN5Clasp15StatisticObject13registerValueINS_11SolveResultETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_113_getExhaustedEPKS2_EEEEjvE6vtab_s
      ;
      bk_lib::
      pod_vector<const_Clasp::StatisticObject::I_*,_std::allocator<const_Clasp::StatisticObject::I_*>_>
      ::push_back((pod_vector<const_Clasp::StatisticObject::I_*,_std::allocator<const_Clasp::StatisticObject::I_*>_>
                   *)StatisticObject::types_s,(I **)&local_50);
      _ZZN5Clasp15StatisticObject13registerValueINS_11SolveResultETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_113_getExhaustedEPKS2_EEEEjvE2id
           = StatisticObject::types_s._8_4_ - 1;
      __cxa_guard_release(&
                          _ZGVZN5Clasp15StatisticObject13registerValueINS_11SolveResultETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_113_getExhaustedEPKS2_EEEEjvE2id
                         );
    }
  }
  StatisticObject::StatisticObject
            (&local_50,obj,
             _ZZN5Clasp15StatisticObject13registerValueINS_11SolveResultETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_113_getExhaustedEPKS2_EEEEjvE2id
            );
  local_48.handle_ = local_50.handle_;
  StatsMap::add(&this_00->super_StatsMap,"exhausted",&local_48);
  uVar8 = (f->solve_).ptr_;
  uVar5 = StatisticObject::registerArray<Clasp::ClaspFacade::SolveData::BoundArray>();
  StatisticObject::StatisticObject(&local_50,(void *)((uVar8 & 0xfffffffffffffffe) + 0x18),uVar5);
  local_48.handle_ = local_50.handle_;
  StatsMap::add(&this_00->super_StatsMap,"costs",&local_48);
  uVar8 = (f->solve_).ptr_;
  uVar5 = StatisticObject::registerArray<Clasp::ClaspFacade::SolveData::BoundArray>();
  StatisticObject::StatisticObject(&local_50,(void *)((uVar8 & 0xfffffffffffffffe) + 0x38),uVar5);
  local_48.handle_ = local_50.handle_;
  StatsMap::add(&this_00->super_StatsMap,"lower",&local_48);
  if (_ZGVZN5Clasp15StatisticObject13registerValueINS_13SharedContextETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_115_getConcurrencyEPKS2_EEEEjvE6vtab_s
      == '\0') {
    Statistics::ClingoView();
  }
  if (_ZGVZN5Clasp15StatisticObject13registerValueINS_13SharedContextETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_115_getConcurrencyEPKS2_EEEEjvE2id
      == '\0') {
    iVar6 = __cxa_guard_acquire(&
                                _ZGVZN5Clasp15StatisticObject13registerValueINS_13SharedContextETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_115_getConcurrencyEPKS2_EEEEjvE2id
                               );
    if (iVar6 != 0) {
      local_50.handle_ =
           (uint64)
           _ZZN5Clasp15StatisticObject13registerValueINS_13SharedContextETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_115_getConcurrencyEPKS2_EEEEjvE6vtab_s
      ;
      bk_lib::
      pod_vector<const_Clasp::StatisticObject::I_*,_std::allocator<const_Clasp::StatisticObject::I_*>_>
      ::push_back((pod_vector<const_Clasp::StatisticObject::I_*,_std::allocator<const_Clasp::StatisticObject::I_*>_>
                   *)StatisticObject::types_s,(I **)&local_50);
      _ZZN5Clasp15StatisticObject13registerValueINS_13SharedContextETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_115_getConcurrencyEPKS2_EEEEjvE2id
           = StatisticObject::types_s._8_4_ - 1;
      __cxa_guard_release(&
                          _ZGVZN5Clasp15StatisticObject13registerValueINS_13SharedContextETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_115_getConcurrencyEPKS2_EEEEjvE2id
                         );
    }
  }
  StatisticObject::StatisticObject
            (&local_50,&f->ctx,
             _ZZN5Clasp15StatisticObject13registerValueINS_13SharedContextETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_115_getConcurrencyEPKS2_EEEEjvE2id
            );
  local_48.handle_ = local_50.handle_;
  StatsMap::add(&this_00->super_StatsMap,"concurrency",&local_48);
  if (_ZGVZN5Clasp15StatisticObject13registerValueINS_13SharedContextETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_110_getWinnerEPKS2_EEEEjvE6vtab_s
      == '\0') {
    Statistics::ClingoView();
  }
  if (_ZGVZN5Clasp15StatisticObject13registerValueINS_13SharedContextETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_110_getWinnerEPKS2_EEEEjvE2id
      == '\0') {
    iVar6 = __cxa_guard_acquire(&
                                _ZGVZN5Clasp15StatisticObject13registerValueINS_13SharedContextETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_110_getWinnerEPKS2_EEEEjvE2id
                               );
    if (iVar6 != 0) {
      local_50.handle_ =
           (uint64)
           _ZZN5Clasp15StatisticObject13registerValueINS_13SharedContextETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_110_getWinnerEPKS2_EEEEjvE6vtab_s
      ;
      bk_lib::
      pod_vector<const_Clasp::StatisticObject::I_*,_std::allocator<const_Clasp::StatisticObject::I_*>_>
      ::push_back((pod_vector<const_Clasp::StatisticObject::I_*,_std::allocator<const_Clasp::StatisticObject::I_*>_>
                   *)StatisticObject::types_s,(I **)&local_50);
      _ZZN5Clasp15StatisticObject13registerValueINS_13SharedContextETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_110_getWinnerEPKS2_EEEEjvE2id
           = StatisticObject::types_s._8_4_ - 1;
      __cxa_guard_release(&
                          _ZGVZN5Clasp15StatisticObject13registerValueINS_13SharedContextETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_110_getWinnerEPKS2_EEEEjvE2id
                         );
    }
  }
  StatisticObject::StatisticObject
            (&local_50,&f->ctx,
             _ZZN5Clasp15StatisticObject13registerValueINS_13SharedContextETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_110_getWinnerEPKS2_EEEEjvE2id
            );
  local_48.handle_ = local_50.handle_;
  StatsMap::add(&this_00->super_StatsMap,"winner",&local_48);
  pSVar1 = &f->step_;
  (this->summary_).step.times.stats_ = pSVar1;
  (this->summary_).step.times.range_.lo = 0;
  (this->summary_).step.times.range_.hi = 5;
  (this->summary_).step.models.stats_ = pSVar1;
  (this->summary_).step.models.range_.lo = 5;
  (this->summary_).step.models.range_.hi = 7;
  StepStats::addTo(&(this->summary_).step,&this_00->super_StatsMap);
  pCVar3 = pSVar1->facade;
  uVar8 = (pCVar3->stats_).ptr_ & 0xfffffffffffffffe;
  if (uVar8 == 0) {
    uVar9 = (pCVar3->builder_).ptr_;
    uVar10 = (uVar9 & 0xfffffffffffffffe) + 0x1c;
    if (pCVar3->type_ != Asp) {
      uVar10 = 0;
    }
    if (uVar9 < 2) {
      uVar10 = 0;
    }
  }
  else {
    uVar10 = *(ulong *)(uVar8 + 8) & 0xfffffffffffffffe;
  }
  if (uVar10 != 0) {
    if (uVar8 == 0) {
      uVar8 = (pCVar3->builder_).ptr_;
      pvVar11 = (void *)((uVar8 & 0xfffffffffffffffe) + 0x1c);
      if (pCVar3->type_ != Asp) {
        pvVar11 = (void *)0x0;
      }
      if (uVar8 < 2) {
        pvVar11 = (void *)0x0;
      }
    }
    else {
      pvVar11 = (void *)(*(ulong *)(uVar8 + 8) & 0xfffffffffffffffe);
    }
    uVar5 = StatisticObject::registerMap<Clasp::Asp::LpStats>();
    StatisticObject::StatisticObject(&local_50,pvVar11,uVar5);
    local_48.handle_ = local_50.handle_;
    StatsMap::add(pSVar4,"lp",&local_48);
    if (1 < (f->accu_).ptr_) {
      uVar8 = (pSVar1->facade->builder_).ptr_;
      PVar2 = pSVar1->facade->type_;
      uVar5 = StatisticObject::registerMap<Clasp::Asp::LpStats>();
      pvVar11 = (void *)((uVar8 & 0xfffffffffffffffe) + 0x1c);
      if (PVar2 != Asp) {
        pvVar11 = (void *)0x0;
      }
      if (uVar8 < 2) {
        pvVar11 = (void *)0x0;
      }
      StatisticObject::StatisticObject(&local_50,pvVar11,uVar5);
      local_48.handle_ = local_50.handle_;
      StatsMap::add(pSVar4,"lpStep",&local_48);
    }
  }
  uVar5 = StatisticObject::registerMap<Clasp::ProblemStats>();
  StatisticObject::StatisticObject(&local_50,&(f->ctx).stats_,uVar5);
  local_48.handle_ = local_50.handle_;
  StatsMap::add(pSVar4,"generator",&local_48);
  pSVar7 = this->keys_;
  uVar5 = StatisticObject::registerMap<Clasp::StatsMap>();
  StatisticObject::StatisticObject(&local_50,pSVar4,uVar5);
  local_48.handle_ = local_50.handle_;
  StatsMap::add(pSVar7,"problem",&local_48);
  pSVar4 = this->keys_;
  uVar5 = StatisticObject::registerMap<Clasp::StatsMap>();
  StatisticObject::StatisticObject(&local_50,local_38,uVar5);
  local_48.handle_ = local_50.handle_;
  StatsMap::add(pSVar4,"solving",&local_48);
  pSVar4 = this->keys_;
  uVar5 = StatisticObject::registerMap<Clasp::StatsMap>();
  StatisticObject::StatisticObject(&local_50,this_00,uVar5);
  local_48.handle_ = local_50.handle_;
  StatsMap::add(pSVar4,"summary",&local_48);
  if (1 < (f->accu_).ptr_) {
    x = (Accu *)operator_new(0x40);
    (x->solving_).keys_.ebo_.buf = (pointer)0x0;
    (x->solving_).keys_.ebo_.size = 0;
    (x->solving_).keys_.ebo_.cap = 0;
    (x->step).models.stats_ = (Summary *)0x0;
    (x->step).models.range_.lo = 0;
    (x->step).models.range_.hi = 0;
    (x->step).times.stats_ = (Summary *)0x0;
    (x->step).times.range_.lo = 0;
    (x->step).times.range_.hi = 0;
    (x->super_StatsMap).keys_.ebo_.buf = (pointer)0x0;
    (x->super_StatsMap).keys_.ebo_.size = 0;
    (x->super_StatsMap).keys_.ebo_.cap = 0;
    SingleOwnerPtr<Clasp::ClaspFacade::Statistics::ClingoView::Accu,_Clasp::DeleteObject>::reset
              (local_40,x);
    uVar8 = local_40->ptr_ & 0xfffffffffffffffe;
    uVar9 = (f->accu_).ptr_ & 0xfffffffffffffffe;
    *(ulong *)(uVar8 + 0x10) = uVar9;
    *(undefined8 *)(uVar8 + 0x18) = 0x500000000;
    *(ulong *)(uVar8 + 0x20) = uVar9;
    *(undefined8 *)(uVar8 + 0x28) = 0x700000005;
  }
  return;
}

Assistant:

ClaspFacade::Statistics::ClingoView::ClingoView(const ClaspFacade& f) {
	keys_ = makeRoot();
	summary_.add("call"       , StatisticObject::value(&f.step_.step));
	summary_.add("result"     , StatisticObject::value<SolveResult, _getResult>(&f.step_.result));
	summary_.add("signal"     , StatisticObject::value<SolveResult, _getSignal>(&f.step_.result));
	summary_.add("exhausted"  , StatisticObject::value<SolveResult, _getExhausted>(&f.step_.result));
	summary_.add("costs"      , StatisticObject::array(&f.solve_->costs));
	summary_.add("lower"      , StatisticObject::array(&f.solve_->lower));
	summary_.add("concurrency", StatisticObject::value<SharedContext, _getConcurrency>(&f.ctx));
	summary_.add("winner"     , StatisticObject::value<SharedContext, _getWinner>(&f.ctx));
	summary_.step.bind(f.step_);
	summary_.step.addTo(summary_);
	if (f.step_.lpStats()) {
		problem_.add("lp", StatisticObject::map(f.step_.lpStats()));
		if (f.incremental()) { problem_.add("lpStep", StatisticObject::map(f.step_.lpStep())); }
	}
	problem_.add("generator", StatisticObject::map(&f.ctx.stats()));
	keys_->add("problem", problem_.toStats());
	keys_->add("solving", solving_.toStats());
	keys_->add("summary", summary_.toStats());

	if (f.incremental()) {
		accu_ = new Accu();
		accu_->step.bind(*f.accu_.get());
	}
}